

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

void __thiscall MT32Emu::BReverbModelImpl<short>::mute(BReverbModelImpl<short> *this)

{
  uint local_18;
  uint local_14;
  Bit32u i_1;
  Bit32u i;
  BReverbModelImpl<short> *this_local;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    for (local_14 = 0; local_14 < this->currentSettings->numberOfAllpasses; local_14 = local_14 + 1)
    {
      RingBuffer<short>::mute(&this->allpasses[local_14]->super_RingBuffer<short>);
    }
  }
  if (this->combs != (CombFilter<short> **)0x0) {
    for (local_18 = 0; local_18 < this->currentSettings->numberOfCombs; local_18 = local_18 + 1) {
      RingBuffer<short>::mute(&this->combs[local_18]->super_RingBuffer<short>);
    }
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}